

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O3

uint64_t lj_carith_shift64(uint64_t x,int32_t sh,int op)

{
  byte bVar1;
  
  bVar1 = (byte)sh;
  switch(op) {
  case 0:
    return x << (bVar1 & 0x3f);
  case 1:
    return x >> (bVar1 & 0x3f);
  case 2:
    return (long)x >> (bVar1 & 0x3f);
  case 3:
    return x << (bVar1 & 0x3f) | x >> 0x40 - (bVar1 & 0x3f);
  case 4:
    x = x >> (bVar1 & 0x3f) | x << 0x40 - (bVar1 & 0x3f);
  }
  return x;
}

Assistant:

uint64_t lj_carith_shift64(uint64_t x, int32_t sh, int op)
{
  switch (op) {
  case IR_BSHL-IR_BSHL: x = lj_carith_shl64(x, sh); break;
  case IR_BSHR-IR_BSHL: x = lj_carith_shr64(x, sh); break;
  case IR_BSAR-IR_BSHL: x = lj_carith_sar64(x, sh); break;
  case IR_BROL-IR_BSHL: x = lj_carith_rol64(x, sh); break;
  case IR_BROR-IR_BSHL: x = lj_carith_ror64(x, sh); break;
  default:
    lj_assertX(0, "bad shift op %d", op);
    break;
  }
  return x;
}